

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

void __thiscall spirv_cross::Compiler::flush_all_atomic_capable_variables(Compiler *this)

{
  size_t sVar1;
  uint *puVar2;
  SPIRVariable *var;
  long lVar3;
  
  sVar1 = (this->global_variables).super_VectorView<unsigned_int>.buffer_size;
  if (sVar1 != 0) {
    puVar2 = (this->global_variables).super_VectorView<unsigned_int>.ptr;
    lVar3 = 0;
    do {
      var = Variant::get<spirv_cross::SPIRVariable>
                      ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                       *(uint *)((long)puVar2 + lVar3));
      flush_dependees(this,var);
      lVar3 = lVar3 + 4;
    } while (sVar1 << 2 != lVar3);
  }
  flush_all_aliased_variables(this);
  return;
}

Assistant:

void Compiler::flush_all_atomic_capable_variables()
{
	for (auto global : global_variables)
		flush_dependees(get<SPIRVariable>(global));
	flush_all_aliased_variables();
}